

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private.hpp
# Opt level: O0

void baryonyx::notice<>(context *ctx,char *fmt)

{
  bool bVar1;
  char *fmt_local;
  context *ctx_local;
  
  bVar1 = is_loggable(ctx->log_priority,5);
  if (bVar1) {
    log<>(_stdout,5,fmt);
  }
  return;
}

Assistant:

void
notice(const context& ctx, const char* fmt, const Args&... args)
{
#ifdef BARYONYX_ENABLE_LOG
    if (!is_loggable(ctx.log_priority, 5))
        return;

    log(stdout, 5, fmt, args...);
#else
    detail::sink(ctx, fmt, args...);
#endif
}